

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int archive_read_support_filter_xz(archive *_a)

{
  int iVar1;
  archive_read *a;
  archive *_a_local;
  
  iVar1 = __archive_read_register_bidder((archive_read *)_a,(void *)0x0,"xz",&xz_bidder_vtable);
  if (iVar1 == 0) {
    _a_local._4_4_ = 0;
  }
  else {
    _a_local._4_4_ = -0x1e;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_filter_xz(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;

	if (__archive_read_register_bidder(a, NULL, "xz",
				&xz_bidder_vtable) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

#if HAVE_LZMA_H && HAVE_LIBLZMA
	return (ARCHIVE_OK);
#else
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external xz program for xz decompression");
	return (ARCHIVE_WARN);
#endif
}